

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

Curl_tree * Curl_splaygetbest(curltime i,Curl_tree *t,Curl_tree **removed)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Curl_tree *pCVar3;
  int iVar4;
  undefined4 uVar5;
  Curl_tree *pCVar6;
  timediff_t tVar7;
  Curl_tree *pCVar8;
  Curl_tree *pCVar9;
  curltime newer;
  curltime older;
  
  newer.tv_sec = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    pCVar8 = (Curl_tree *)0x0;
    pCVar9 = (Curl_tree *)0x0;
  }
  else {
    pCVar6 = Curl_splay((curltime)ZEXT816(0),t);
    uVar1 = (pCVar6->key).tv_sec;
    uVar2 = (pCVar6->key).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._8_8_ = i._8_8_ & 0xffffffff;
    older._12_4_ = 0;
    tVar7 = Curl_timediff_us(newer,older);
    pCVar8 = pCVar6;
    pCVar9 = (Curl_tree *)0x0;
    if (-1 < tVar7) {
      pCVar8 = pCVar6->samen;
      pCVar9 = pCVar6;
      if (pCVar8 == pCVar6) {
        pCVar8 = pCVar6->larger;
      }
      else {
        iVar4 = (pCVar6->key).tv_usec;
        uVar5 = *(undefined4 *)&(pCVar6->key).field_0xc;
        (pCVar8->key).tv_sec = (pCVar6->key).tv_sec;
        (pCVar8->key).tv_usec = iVar4;
        *(undefined4 *)&(pCVar8->key).field_0xc = uVar5;
        pCVar3 = pCVar6->larger;
        pCVar8->smaller = pCVar6->smaller;
        pCVar8->larger = pCVar3;
        pCVar6 = pCVar6->samep;
        pCVar8->samep = pCVar6;
        pCVar6->samen = pCVar8;
      }
    }
  }
  *removed = pCVar9;
  return pCVar8;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct curltime i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  static const struct curltime tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  DEBUGASSERT(t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}